

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GeneralMatrixMatrix.h
# Opt level: O1

void Eigen::internal::
     generic_product_impl<Eigen::Product<Eigen::Transpose<Eigen::Matrix<float,-1,-1,0,-1,-1>const>,Eigen::DiagonalWrapper<Eigen::Matrix<float,-1,1,0,-1,1>const>,1>,Eigen::Matrix<float,-1,-1,0,-1,-1>,Eigen::DenseShape,Eigen::DenseShape,8>
     ::evalTo<Eigen::Matrix<float,_1,_1,0,_1,_1>>
               (Matrix<float,__1,__1,_0,__1,__1> *dst,
               Product<Eigen::Transpose<const_Eigen::Matrix<float,__1,__1,_0,__1,__1>_>,_Eigen::DiagonalWrapper<const_Eigen::Matrix<float,__1,_1,_0,__1,_1>_>,_1>
               *lhs,Matrix<float,__1,__1,_0,__1,__1> *rhs)

{
  long lVar1;
  ActualDstType actualDst;
  assign_op<float,_float> local_39;
  undefined1 local_38 [24];
  
  lVar1 = (rhs->super_PlainObjectBase<Eigen::Matrix<float,__1,__1,_0,__1,__1>_>).m_storage.m_rows;
  local_38._0_8_ =
       (dst->super_PlainObjectBase<Eigen::Matrix<float,__1,__1,_0,__1,__1>_>).m_storage.m_rows;
  local_38._8_8_ =
       (dst->super_PlainObjectBase<Eigen::Matrix<float,__1,__1,_0,__1,__1>_>).m_storage.m_cols;
  if ((lVar1 < 1) ||
     (0x13 < (long)&(((Nested)local_38._8_8_)->
                    super_PlainObjectBase<Eigen::Matrix<float,__1,_1,_0,__1,_1>_>).m_storage.m_data
             + (long)&(((non_const_type)local_38._0_8_)->
                      super_PlainObjectBase<Eigen::Matrix<float,__1,__1,_0,__1,__1>_>).m_storage.
                      m_data + lVar1)) {
    local_38._16_8_ = local_38._16_8_ & 0xffffffff00000000;
    if ((long)(local_38._8_8_ | local_38._0_8_) < 0) {
      __assert_fail("rows >= 0 && (RowsAtCompileTime == Dynamic || RowsAtCompileTime == rows) && cols >= 0 && (ColsAtCompileTime == Dynamic || ColsAtCompileTime == cols)"
                    ,
                    "/workspace/llm4binary/github/license_c_cmakelists/patrikhuber[P]eos/3rdparty/eigen/Eigen/src/Core/CwiseNullaryOp.h"
                    ,0x4a,
                    "Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<float>, Eigen::Matrix<float, -1, -1>>::CwiseNullaryOp(Index, Index, const NullaryOp &) [NullaryOp = Eigen::internal::scalar_constant_op<float>, MatrixType = Eigen::Matrix<float, -1, -1>]"
                   );
    }
    call_dense_assignment_loop<Eigen::Matrix<float,_1,_1,0,_1,_1>>
              (dst,(CwiseNullaryOp<Eigen::internal::scalar_constant_op<float>,_Eigen::Matrix<float,__1,__1,_0,__1,__1>_>
                    *)local_38,&local_39);
    local_38._0_4_ = 0x3f800000;
    scaleAndAddTo<Eigen::Matrix<float,_1,_1,0,_1,_1>>(dst,lhs,rhs,(Scalar *)local_38);
  }
  else {
    local_38._0_8_ = (lhs->m_lhs).m_matrix;
    local_38._8_8_ = (lhs->m_rhs).m_diagonal;
    local_38._16_8_ = rhs;
    if ((((lhs->m_rhs).m_diagonal)->super_PlainObjectBase<Eigen::Matrix<float,__1,_1,_0,__1,_1>_>).
        m_storage.m_rows != lVar1) {
      __assert_fail("lhs.cols() == rhs.rows() && \"invalid matrix product\" && \"if you wanted a coeff-wise or a dot product use the respective explicit functions\""
                    ,
                    "/workspace/llm4binary/github/license_c_cmakelists/patrikhuber[P]eos/3rdparty/eigen/Eigen/src/Core/Product.h"
                    ,0x62,
                    "Eigen::Product<Eigen::Product<Eigen::Transpose<const Eigen::Matrix<float, -1, -1>>, Eigen::DiagonalWrapper<const Eigen::Matrix<float, -1, 1>>, 1>, Eigen::Matrix<float, -1, -1>, 1>::Product(const Lhs &, const Rhs &) [Lhs = Eigen::Product<Eigen::Transpose<const Eigen::Matrix<float, -1, -1>>, Eigen::DiagonalWrapper<const Eigen::Matrix<float, -1, 1>>, 1>, Rhs = Eigen::Matrix<float, -1, -1>, Option = 1]"
                   );
    }
    call_restricted_packet_assignment_no_alias<Eigen::Matrix<float,_1,_1,0,_1,_1>,Eigen::Product<Eigen::Product<Eigen::Transpose<Eigen::Matrix<float,_1,_1,0,_1,_1>const>,Eigen::DiagonalWrapper<Eigen::Matrix<float,_1,1,0,_1,1>const>,1>,Eigen::Matrix<float,_1,_1,0,_1,_1>,1>,Eigen::internal::assign_op<float,float>>
              (dst,(Product<Eigen::Product<Eigen::Transpose<const_Eigen::Matrix<float,__1,__1,_0,__1,__1>_>,_Eigen::DiagonalWrapper<const_Eigen::Matrix<float,__1,_1,_0,__1,_1>_>,_1>,_Eigen::Matrix<float,__1,__1,_0,__1,__1>,_1>
                    *)local_38,&local_39);
  }
  return;
}

Assistant:

static void evalTo(Dst& dst, const Lhs& lhs, const Rhs& rhs)
  {
    // See http://eigen.tuxfamily.org/bz/show_bug.cgi?id=404 for a discussion and helper program
    // to determine the following heuristic.
    // EIGEN_GEMM_TO_COEFFBASED_THRESHOLD is typically defined to 20 in GeneralProduct.h,
    // unless it has been specialized by the user or for a given architecture.
    // Note that the condition rhs.rows()>0 was required because lazy product is (was?) not happy with empty inputs.
    // I'm not sure it is still required.
    if((rhs.rows()+dst.rows()+dst.cols())<EIGEN_GEMM_TO_COEFFBASED_THRESHOLD && rhs.rows()>0)
      lazyproduct::eval_dynamic(dst, lhs, rhs, internal::assign_op<typename Dst::Scalar,Scalar>());
    else
    {
      dst.setZero();
      scaleAndAddTo(dst, lhs, rhs, Scalar(1));
    }
  }